

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_op.cc
# Opt level: O0

PcodeOp * Funcdata::findPrimaryBranch
                    (const_iterator iter,const_iterator enditer,bool findbranch,bool findcall,
                    bool findreturn)

{
  PcodeOp *this;
  bool bVar1;
  OpCode OVar2;
  reference ppVar3;
  Varnode *this_00;
  PcodeOp *op;
  bool findreturn_local;
  bool findcall_local;
  const_iterator cStack_20;
  bool findbranch_local;
  const_iterator enditer_local;
  const_iterator iter_local;
  
  cStack_20._M_node = enditer._M_node;
  enditer_local._M_node = iter._M_node;
  do {
    bVar1 = std::operator!=(&enditer_local,&stack0xffffffffffffffe0);
    if (!bVar1) {
      return (PcodeOp *)0x0;
    }
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_SeqNum,_PcodeOp_*>_>::operator*
                       (&enditer_local);
    this = ppVar3->second;
    OVar2 = PcodeOp::code(this);
    switch(OVar2) {
    case CPUI_BRANCH:
    case CPUI_CBRANCH:
      if (findbranch) {
        this_00 = PcodeOp::getIn(this,0);
        bVar1 = Varnode::isConstant(this_00);
        if (!bVar1) {
          return this;
        }
      }
      break;
    case CPUI_BRANCHIND:
      if (findbranch) {
        return this;
      }
      break;
    case CPUI_CALL:
    case CPUI_CALLIND:
      if (findcall) {
        return this;
      }
      break;
    default:
      break;
    case CPUI_RETURN:
      if (findreturn) {
        return this;
      }
    }
    std::_Rb_tree_const_iterator<std::pair<const_SeqNum,_PcodeOp_*>_>::operator++(&enditer_local);
  } while( true );
}

Assistant:

PcodeOp *Funcdata::findPrimaryBranch(PcodeOpTree::const_iterator iter,PcodeOpTree::const_iterator enditer,
				     bool findbranch,bool findcall,bool findreturn)
{
  while(iter != enditer) {
    PcodeOp *op = (*iter).second;
    switch(op->code()) {
    case CPUI_BRANCH:
    case CPUI_CBRANCH:
      if (findbranch) {
	if (!op->getIn(0)->isConstant()) // Make sure this is not an internal branch
	  return op;
      }
      break;
    case CPUI_BRANCHIND:
      if (findbranch)
	return op;
      break;
    case CPUI_CALL:
    case CPUI_CALLIND:
      if (findcall)
	return op;
      break;
    case CPUI_RETURN:
      if (findreturn)
	return op;
      break;
    default:
      break;
    }
    ++iter;
  }
  return (PcodeOp *)0;
}